

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

uint ConvertFromAutoRef(uint target,uint source)

{
  ExternTypeInfo *pEVar1;
  
  if (source != target) {
    do {
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::commonLinker + 0x200),
                          source);
      if (pEVar1->baseType == 0) {
        return 0;
      }
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::commonLinker + 0x200),
                          source);
      source = pEVar1->baseType;
    } while (source != target);
  }
  return 1;
}

Assistant:

unsigned ConvertFromAutoRef(unsigned int target, unsigned int source)
{
	if(source == target)
		return 1;
	while(NULLC::commonLinker->exTypes[source].baseType)
	{
		source = NULLC::commonLinker->exTypes[source].baseType;
		if(source == target)
			return 1;
	}
	return 0;
}